

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void __thiscall ImGuiColumns::ImGuiColumns(ImGuiColumns *this)

{
  (this->Splitter)._Channels.Size = 0;
  (this->Splitter)._Channels.Capacity = 0;
  (this->Splitter)._Channels.Data = (ImDrawChannel *)0x0;
  (this->HostInitialClipRect).Min.x = 0.0;
  (this->HostInitialClipRect).Min.y = 0.0;
  (this->HostInitialClipRect).Max.x = 0.0;
  (this->HostInitialClipRect).Max.y = 0.0;
  (this->HostBackupClipRect).Min.x = 0.0;
  (this->HostBackupClipRect).Min.y = 0.0;
  (this->HostBackupClipRect).Max.x = 0.0;
  (this->HostBackupClipRect).Max.y = 0.0;
  (this->HostWorkRect).Min.x = 0.0;
  (this->HostWorkRect).Min.y = 0.0;
  (this->HostWorkRect).Max.x = 0.0;
  (this->HostWorkRect).Max.y = 0.0;
  (this->Columns).Size = 0;
  (this->Columns).Capacity = 0;
  (this->Columns).Data = (ImGuiColumnData *)0x0;
  (this->Splitter)._Current = 0;
  (this->Splitter)._Count = 1;
  Clear(this);
  return;
}

Assistant:

ImGuiColumns()      { Clear(); }